

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

int pcmp_ilen(ZMMReg *r,uint8_t ctrl)

{
  bool bVar1;
  int local_18;
  int val;
  uint8_t ctrl_local;
  ZMMReg *r_local;
  
  local_18 = 0;
  if ((ctrl & 1) == 0) {
    while( true ) {
      bVar1 = false;
      if (local_18 < 0x10) {
        bVar1 = r->_b_ZMMReg[local_18] != '\0';
      }
      if (!bVar1) break;
      local_18 = local_18 + 1;
    }
  }
  else {
    while( true ) {
      bVar1 = false;
      if (local_18 < 8) {
        bVar1 = r->_w_ZMMReg[local_18] != 0;
      }
      if (!bVar1) break;
      local_18 = local_18 + 1;
    }
  }
  return local_18;
}

Assistant:

static inline int pcmp_ilen(Reg *r, uint8_t ctrl)
{
    int val = 0;

    if (ctrl & 1) {
        while (val < 8 && r->W(val)) {
            val++;
        }
    } else {
        while (val < 16 && r->B(val)) {
            val++;
        }
    }

    return val;
}